

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void updateAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  int target;
  uint uVar1;
  CollSeq *zP4;
  int iVar2;
  AggInfo_func *pAVar3;
  FuncDef *zP4_00;
  int nReg;
  int iVar4;
  int p1;
  ExprList_item *pEVar5;
  Expr **ppEVar6;
  uint local_40;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  sqlite3ExprCacheClear(pParse);
  pAVar3 = pAggInfo->aFunc;
  p1 = 0;
  for (iVar2 = 0; iVar2 < pAggInfo->nFunc; iVar2 = iVar2 + 1) {
    pList = (pAVar3->pExpr->x).pList;
    local_40 = 0;
    nReg = 0;
    target = 0;
    if (pList != (ExprList *)0x0) {
      nReg = pList->nExpr;
      target = sqlite3GetTempRange(pParse,nReg);
      sqlite3ExprCodeExprList(pParse,pList,target,1);
    }
    if (-1 < pAVar3->iDistinct) {
      local_40 = sqlite3VdbeMakeLabel(p);
      codeDistinct(pParse,pAVar3->iDistinct,local_40,1,target);
    }
    zP4_00 = pAVar3->pFunc;
    if ((zP4_00->flags & 8) != 0) {
      pEVar5 = pList->a;
      zP4 = (CollSeq *)0x0;
      for (iVar4 = 0; (zP4 == (CollSeq *)0x0 && (iVar4 < nReg)); iVar4 = iVar4 + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEVar5->pExpr);
        pEVar5 = pEVar5 + 1;
      }
      if (zP4 == (CollSeq *)0x0) {
        zP4 = pParse->db->pDfltColl;
      }
      if (p1 == 0) {
        if (pAggInfo->nAccumulator == 0) {
          p1 = 0;
        }
        else {
          p1 = pParse->nMem + 1;
          pParse->nMem = p1;
        }
      }
      sqlite3VdbeAddOp4(p,0x11,p1,0,0,(char *)zP4,-4);
      zP4_00 = pAVar3->pFunc;
    }
    sqlite3VdbeAddOp4(p,0x7b,0,target,pAVar3->iMem,(char *)zP4_00,-5);
    if (p->aOp != (Op *)0x0) {
      p->aOp[(long)p->nOp + -1].p5 = (u8)nReg;
    }
    sqlite3ExprCacheRemove(pParse,target,nReg);
    sqlite3ReleaseTempRange(pParse,target,nReg);
    if (local_40 != 0) {
      if (p->aLabel != (int *)0x0) {
        p->aLabel[(int)~local_40] = p->nOp;
      }
      sqlite3ExprCacheClear(pParse);
    }
    pAVar3 = pAVar3 + 1;
  }
  iVar2 = 0;
  uVar1 = 0;
  if (p1 != 0) {
    uVar1 = sqlite3VdbeAddOp1(p,0x1b,p1);
  }
  sqlite3ExprCacheClear(pParse);
  ppEVar6 = &pAggInfo->aCol->pExpr;
  for (; iVar2 < pAggInfo->nAccumulator; iVar2 = iVar2 + 1) {
    sqlite3ExprCode(pParse,*ppEVar6,*(int *)((long)ppEVar6 + -4));
    ppEVar6 = ppEVar6 + 4;
  }
  pAggInfo->directMode = '\0';
  sqlite3ExprCacheClear(pParse);
  if ((0 < (int)uVar1) && (uVar1 < (uint)p->nOp)) {
    p->aOp[uVar1].p2 = p->nOp;
  }
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  sqlite3ExprCacheClear(pParse);
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 1);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(v);
      assert( nArg==1 );
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->flags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp4(v, OP_AggStep, 0, regAgg, pF->iMem,
                      (void*)pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ExprCacheAffinityChange(pParse, regAgg, nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
      sqlite3ExprCacheClear(pParse);
    }
  }

  /* Before populating the accumulator registers, clear the column cache.
  ** Otherwise, if any of the required column values are already present 
  ** in registers, sqlite3ExprCode() may use OP_SCopy to copy the value
  ** to pC->iMem. But by the time the value is used, the original register
  ** may have been used, invalidating the underlying buffer holding the
  ** text or blob value. See ticket [883034dcb5].
  **
  ** Another solution would be to change the OP_SCopy used to copy cached
  ** values to an OP_Copy.
  */
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit);
  }
  sqlite3ExprCacheClear(pParse);
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  sqlite3ExprCacheClear(pParse);
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}